

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

Type * __thiscall
flatbuffers::java::JavaGenerator::DestinationType
          (Type *__return_storage_ptr__,JavaGenerator *this,Type *type,bool vectorelem)

{
  BaseType BVar1;
  undefined6 uVar2;
  Type local_40;
  byte local_19;
  Type *pTStack_18;
  bool vectorelem_local;
  Type *type_local;
  JavaGenerator *this_local;
  
  local_19 = vectorelem;
  pTStack_18 = type;
  type_local = (Type *)this;
  switch(type->base_type) {
  case BASE_TYPE_UCHAR:
    Type::Type(__return_storage_ptr__,BASE_TYPE_INT,(StructDef *)0x0,(EnumDef *)0x0,0);
    break;
  case BASE_TYPE_USHORT:
    Type::Type(__return_storage_ptr__,BASE_TYPE_INT,(StructDef *)0x0,(EnumDef *)0x0,0);
    break;
  case BASE_TYPE_UINT:
    Type::Type(__return_storage_ptr__,BASE_TYPE_LONG,(StructDef *)0x0,(EnumDef *)0x0,0);
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    if (vectorelem) {
      Type::VectorType(&local_40,type);
      DestinationType(__return_storage_ptr__,this,&local_40,(bool)(local_19 & 1));
      return __return_storage_ptr__;
    }
  default:
    BVar1 = type->element;
    __return_storage_ptr__->base_type = type->base_type;
    __return_storage_ptr__->element = BVar1;
    __return_storage_ptr__->struct_def = type->struct_def;
    __return_storage_ptr__->enum_def = type->enum_def;
    uVar2 = *(undefined6 *)&type->field_0x1a;
    __return_storage_ptr__->fixed_length = type->fixed_length;
    *(undefined6 *)&__return_storage_ptr__->field_0x1a = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Type DestinationType(const Type &type, bool vectorelem) const {
    switch (type.base_type) {
      // We use int for both uchar/ushort, since that generally means less
      // casting than using short for uchar.
      case BASE_TYPE_UCHAR: return Type(BASE_TYPE_INT);
      case BASE_TYPE_USHORT: return Type(BASE_TYPE_INT);
      case BASE_TYPE_UINT: return Type(BASE_TYPE_LONG);
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR:
        if (vectorelem) return DestinationType(type.VectorType(), vectorelem);
        FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default: return type;
    }
  }